

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::FlowBuffer(FlowBuffer *this,LineBreakStyle linebreak_style)

{
  this->_vptr_FlowBuffer = (_func_int **)&PTR__FlowBuffer_00104d68;
  this->buffer_length_ = 0;
  this->buffer_ = (uchar *)0x0;
  this->orig_data_begin_ = (const_byteptr)0x0;
  this->orig_data_end_ = (const_byteptr)0x0;
  this->linebreak_style_ = linebreak_style;
  this->linebreak_style_default = linebreak_style;
  this->linebreaker_ = '\0';
  if (linebreak_style != CR_OR_LF) {
    if (linebreak_style != STRICT_CRLF) goto LAB_0010231b;
    linebreak_style = CR_LF_NUL;
  }
  this->state_ = linebreak_style;
LAB_0010231b:
  this->mode_ = CR_OR_LF_0;
  this->frame_length_ = 0;
  this->chunked_ = false;
  this->data_seq_at_orig_data_end_ = 0;
  this->eof_ = false;
  this->have_pending_request_ = false;
  this->buffer_n_ = 0;
  NewMessage(this);
  return;
}

Assistant:

FlowBuffer::FlowBuffer(LineBreakStyle linebreak_style)
	{
	buffer_length_ = 0;
	buffer_ = nullptr;

	orig_data_begin_ = nullptr;
	orig_data_end_ = nullptr;

	linebreak_style_ = linebreak_style;
	linebreak_style_default = linebreak_style;
	linebreaker_ = 0;
	ResetLineState();

	mode_ = UNKNOWN_MODE;
	frame_length_ = 0;
	chunked_ = false;

	data_seq_at_orig_data_end_ = 0;
	eof_ = false;
	have_pending_request_ = false;

	buffer_n_ = 0;

	NewMessage();
	}